

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

Reflection * google::protobuf::internal::GetReflectionOrDie(Message *m)

{
  string *psVar1;
  LogMessage *this;
  LogMessage *other;
  string *mtype;
  Descriptor *d;
  Reflection *r;
  string *in_stack_ffffffffffffff48;
  LogMessage *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff60;
  undefined1 local_41 [33];
  undefined1 *local_20;
  undefined8 local_18;
  Reflection *local_10;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_10 = Message::GetReflection((Message *)in_stack_ffffffffffffff50);
  if (local_10 == (Reflection *)0x0) {
    local_18 = Message::GetDescriptor((Message *)in_stack_ffffffffffffff50);
    if ((Descriptor *)local_18 == (Descriptor *)0x0) {
      in_stack_ffffffffffffff60 = (LogMessage *)local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_41 + 1),"unknown",(allocator *)in_stack_ffffffffffffff60);
      std::allocator<char>::~allocator((allocator<char> *)local_41);
    }
    else {
      psVar1 = Descriptor::name_abi_cxx11_((Descriptor *)local_18);
      std::__cxx11::string::string((string *)(local_41 + 1),(string *)psVar1);
    }
    local_20 = local_41 + 1;
    LogMessage::LogMessage
              (in_stack_ffffffffffffff60,level,(char *)in_stack_ffffffffffffff50,
               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    LogMessage::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    this = LogMessage::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    other = LogMessage::operator<<(this,(char *)in_stack_ffffffffffffff48);
    LogFinisher::operator=((LogFinisher *)this,other);
    LogMessage::~LogMessage((LogMessage *)0x4532a4);
    std::__cxx11::string::~string((string *)(local_41 + 1));
  }
  return local_10;
}

Assistant:

static const Reflection* GetReflectionOrDie(const Message& m) {
  const Reflection* r = m.GetReflection();
  if (r == nullptr) {
    const Descriptor* d = m.GetDescriptor();
    const std::string& mtype = d ? d->name() : "unknown";
    // RawMessage is one known type for which GetReflection() returns nullptr.
    GOOGLE_LOG(FATAL) << "Message does not support reflection (type " << mtype << ").";
  }
  return r;
}